

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.h
# Opt level: O0

void __thiscall
BamTools::BamAlignment::BamAlignmentSupportData::BamAlignmentSupportData
          (BamAlignmentSupportData *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  in_RDI[0x30] = (string)0x0;
  return;
}

Assistant:

BamAlignmentSupportData()
            : BlockLength(0)
            , NumCigarOperations(0)
            , QueryNameLength(0)
            , QuerySequenceLength(0)
            , HasCoreOnly(false)
        {}